

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::GenerateNodeAnimations
          (FBXConverter *this,vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *node_anims,
          string *fixed_name,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,double *min_time)

{
  pointer ppAVar1;
  AnimationCurveNode *this_00;
  bool bVar2;
  AnimationCurveMap *pAVar3;
  mapped_type *this_01;
  Model *pMVar4;
  FBXConverter *pFVar5;
  char *pcVar6;
  iterator iVar7;
  ImportSettings *pIVar8;
  mapped_type *pmVar9;
  aiNodeAnim *paVar10;
  Model *extraout_RDX;
  Model *extraout_RDX_00;
  Model *extraout_RDX_01;
  TransformationComp TVar11;
  AnimationCurveNode *pAVar12;
  long lVar13;
  _Base_ptr p_Var14;
  uint uVar15;
  FBXConverter *pFVar16;
  FBXConverter *this_02;
  uint uVar17;
  Object *pOVar18;
  Object *pOVar19;
  pointer ppAVar20;
  bool bVar21;
  aiNodeAnim *na;
  FBXConverter *local_2b0;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *local_2a8;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *local_2a0;
  aiNodeAnim *inv;
  AnimationCurveNode *node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  NodeMap node_property_map;
  const_iterator chain [17];
  aiNodeAnim *nd;
  undefined7 extraout_var;
  
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar20 = (curves->
             super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (curves->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_2a8 = curves;
  local_2a0 = node_anims;
  node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       node_property_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppAVar1 == ppAVar20) {
    __assert_fail("curves.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xa92,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  bVar2 = this->doc->settings->strictMode;
  pOVar18 = (Object *)0x0;
  for (; ppAVar20 != ppAVar1; ppAVar20 = ppAVar20 + 1) {
    pAVar12 = *ppAVar20;
    pOVar19 = pAVar12->target;
    if ((pOVar18 != (Object *)0x0) && (bVar21 = pOVar19 != pOVar18, pOVar19 = pOVar18, bVar21)) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x161f6b);
    }
    if ((bVar2 != false) && (pAVar12->target != pOVar19)) {
      __assert_fail("node->Target() == target",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0xa81,
                    "void Assimp::FBX::validateAnimCurveNodes(const std::vector<const AnimationCurveNode *> &, bool)"
                   );
    }
    pOVar18 = pOVar19;
  }
  ppAVar1 = (local_2a8->
            super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pAVar12 = (AnimationCurveNode *)0x0;
  for (ppAVar20 = (local_2a8->
                  super__Vector_base<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppAVar20 != ppAVar1;
      ppAVar20 = ppAVar20 + 1) {
    this_00 = *ppAVar20;
    node = this_00;
    if (this_00 == (AnimationCurveNode *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0xa99,
                    "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                   );
    }
    if ((this_00->prop)._M_string_length == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                     "target property for animation curve not set: ",&(this_00->super_Object).name);
      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
      LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
      std::__cxx11::string::~string((string *)chain);
    }
    else {
      pAVar3 = AnimationCurveNode::Curves_abi_cxx11_(this_00);
      pAVar12 = this_00;
      if ((pAVar3->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain,
                       "no animation curves assigned to AnimationCurveNode: ",
                       &(node->super_Object).name);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)chain);
        LogFunctions<Assimp::FBXImporter>::LogWarn((format *)&nd);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
        std::__cxx11::string::~string((string *)chain);
      }
      else {
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
                  ::operator[](&node_property_map,&node->prop);
        std::
        vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
        ::push_back(this_01,&node);
      }
    }
  }
  if (pAVar12 == (AnimationCurveNode *)0x0) {
    __assert_fail("curve_node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaa9,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  pMVar4 = AnimationCurveNode::TargetAsModel(pAVar12);
  if (pMVar4 == (Model *)0x0) {
    __assert_fail("curve_node->TargetAsModel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0xaaa,
                  "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                 );
  }
  pFVar5 = (FBXConverter *)AnimationCurveNode::TargetAsModel(pAVar12);
  this_02 = (FBXConverter *)chain;
  bVar2 = false;
  pFVar16 = (FBXConverter *)0x0;
  memset(this_02,0,0x88);
  local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &(pFVar5->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_2a8 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
               *)0x0;
  local_2b0 = pFVar5;
  for (lVar13 = 0; lVar13 != 0x11; lVar13 = lVar13 + 1) {
    TVar11 = (TransformationComp)lVar13;
    if ((TVar11 & (TransformationComp_GeometricScaling|TransformationComp_ScalingPivot)) ==
        TransformationComp_RotationPivotInverse) {
      chain[lVar13]._M_node = &node_property_map._M_t._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      pcVar6 = NameTransformationCompProperty(this_02,TVar11);
      std::__cxx11::string::string((string *)&nd,pcVar6,(allocator *)&node);
      pFVar16 = (FBXConverter *)&nd;
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
              ::find(&node_property_map._M_t,(key_type *)&nd);
      chain[lVar13]._M_node = iVar7._M_node;
      this_02 = (FBXConverter *)&nd;
      std::__cxx11::string::~string((string *)&nd);
      if ((_Rb_tree_header *)iVar7._M_node != &node_property_map._M_t._M_impl.super__Rb_tree_header)
      {
        pIVar8 = this->doc->settings;
        if (pIVar8->optimizeEmptyAnimationCurves == true) {
          pFVar16 = local_2b0;
          bVar21 = IsRedundantAnimationData
                             (this_02,(Model *)local_2b0,TVar11,
                              (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                               *)(iVar7._M_node + 2));
          pIVar8 = (ImportSettings *)CONCAT71(extraout_var,bVar21);
          if (bVar21) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &node,"dropping redundant animation channel for node ",local_270);
            pFVar16 = (FBXConverter *)&node;
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
            basic_formatter<std::__cxx11::string>
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&nd,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&node);
            LogFunctions<Assimp::FBXImporter>::LogDebug((format *)&nd);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&nd);
            this_02 = (FBXConverter *)&node;
            std::__cxx11::string::~string((string *)&node);
            goto LAB_001621c6;
          }
        }
        bVar2 = (bool)(bVar2 | ((TVar11 & (TransformationComp_GeometricScaling|
                                          TransformationComp_ScalingPivot)) !=
                                TransformationComp_Translation && lVar13 != 0xc));
        local_2a8 = (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                     *)CONCAT71((int7)((ulong)pIVar8 >> 8),1);
      }
    }
LAB_001621c6:
  }
  if (((ulong)local_2a8 & 1) == 0) {
    LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x16247a);
  }
  else if ((bVar2) ||
          (pFVar16 = local_2b0, bVar2 = NeedsComplexTransformationChain(this_02,(Model *)local_2b0),
          bVar2)) {
    uVar15 = 1;
    uVar17 = 0;
    for (lVar13 = 0; lVar13 != 0x11; lVar13 = lVar13 + 1) {
      p_Var14 = chain[lVar13]._M_node;
      if ((_Rb_tree_header *)p_Var14 != &node_property_map._M_t._M_impl.super__Rb_tree_header) {
        if (lVar13 == 0xd) {
          __assert_fail("comp != TransformationComp_ScalingPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xafd,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        if (lVar13 == 9) {
          __assert_fail("comp != TransformationComp_RotationPivotInverse",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xafc,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        TVar11 = (TransformationComp)lVar13;
        NameTransformationChainNode((string *)&nd,pFVar16,fixed_name,TVar11);
        na = (aiNodeAnim *)0x0;
        if (TransformationComp_GeometricScaling < TVar11) {
LAB_001626db:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                        ,0xb61,
                        "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                       );
        }
        uVar17 = uVar17 | uVar15;
        pFVar16 = (FBXConverter *)&nd;
        if ((0x4c38U >>
             (TVar11 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation)) &
            1) == 0) {
          if ((0x81c0U >>
               (TVar11 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation))
              & 1) == 0) {
            if ((0x11000U >>
                 (TVar11 & (TransformationComp_GeometricScaling|TransformationComp_GeometricRotation
                           )) & 1) == 0) goto LAB_001626db;
            na = GenerateScalingNodeAnim
                           (this,(string *)&nd,extraout_RDX,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)(p_Var14 + 2),layer_map,start,stop,max_time,min_time);
          }
          else {
            na = GenerateRotationNodeAnim
                           (this,(string *)&nd,(Model *)local_2b0,
                            (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                             *)(p_Var14 + 2),layer_map,start,stop,max_time,min_time);
LAB_001623a9:
            if (na == (aiNodeAnim *)0x0) {
              __assert_fail("na",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                            ,0xb64,
                            "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                           );
            }
          }
        }
        else {
          p_Var14 = p_Var14 + 2;
          na = GenerateTranslationNodeAnim
                         (this,(string *)&nd,extraout_RDX,
                          (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                           *)p_Var14,layer_map,start,stop,max_time,min_time,false);
          if (lVar13 == 5) {
            NameTransformationChainNode
                      ((string *)&node,pFVar16,fixed_name,TransformationComp_RotationPivotInverse);
            pFVar16 = (FBXConverter *)&node;
            paVar10 = GenerateTranslationNodeAnim
                                (this,(string *)&node,extraout_RDX_00,
                                 (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                  *)p_Var14,layer_map,start,stop,max_time,min_time,true);
            inv = paVar10;
            if (((paVar10->mNumPositionKeys == 0) && (paVar10->mNumRotationKeys == 0)) &&
               (paVar10->mNumScalingKeys == 0)) {
              aiNodeAnim::~aiNodeAnim(paVar10);
              operator_delete(paVar10);
            }
            else {
              pFVar16 = (FBXConverter *)&inv;
              std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                        (local_2a0,(value_type *)pFVar16);
            }
            uVar17 = uVar17 | uVar15 << 4;
            std::__cxx11::string::~string((string *)&node);
            goto LAB_001623a9;
          }
          if (lVar13 == 0xb) {
            NameTransformationChainNode
                      ((string *)&node,pFVar16,fixed_name,TransformationComp_ScalingPivotInverse);
            paVar10 = GenerateTranslationNodeAnim
                                (this,(string *)&node,extraout_RDX_01,
                                 (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                                  *)p_Var14,layer_map,start,stop,max_time,min_time,true);
            inv = paVar10;
            if (((paVar10->mNumPositionKeys == 0) && (paVar10->mNumRotationKeys == 0)) &&
               (paVar10->mNumScalingKeys == 0)) {
              aiNodeAnim::~aiNodeAnim(paVar10);
              operator_delete(paVar10);
            }
            else {
              std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back(local_2a0,&inv);
            }
            __assert_fail("TransformationComp_RotationPivotInverse > i",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                          ,0xb4e,
                          "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                         );
          }
        }
        paVar10 = na;
        if (((na->mNumPositionKeys == 0) && (na->mNumRotationKeys == 0)) &&
           (na->mNumScalingKeys == 0)) {
          aiNodeAnim::~aiNodeAnim(na);
          operator_delete(paVar10);
        }
        else {
          pFVar16 = (FBXConverter *)&na;
          std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                    (local_2a0,(value_type *)pFVar16);
        }
        std::__cxx11::string::~string((string *)&nd);
      }
      uVar15 = uVar15 * 2;
    }
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::operator[](&this->node_anim_chain_bits,fixed_name);
    *pmVar9 = uVar17;
  }
  else {
    paVar10 = GenerateSimpleNodeAnim
                        (this,fixed_name,(Model *)local_2b0,chain,
                         (const_iterator)&node_property_map._M_t._M_impl.super__Rb_tree_header,
                         layer_map,start,stop,max_time,min_time,true);
    nd = paVar10;
    if (paVar10 == (aiNodeAnim *)0x0) {
      __assert_fail("nd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                    ,0xae6,
                    "void Assimp::FBX::FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim *> &, const std::string &, const std::vector<const AnimationCurveNode *> &, const LayerMap &, int64_t, int64_t, double &, double &)"
                   );
    }
    if (((paVar10->mNumPositionKeys == 0) && (paVar10->mNumRotationKeys == 0)) &&
       (paVar10->mNumScalingKeys == 0)) {
      aiNodeAnim::~aiNodeAnim(paVar10);
      operator_delete(paVar10);
    }
    else {
      std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back(local_2a0,&nd);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>_>_>_>
  ::~_Rb_tree(&node_property_map._M_t);
  return;
}

Assistant:

void FBXConverter::GenerateNodeAnimations(std::vector<aiNodeAnim*>& node_anims,
            const std::string& fixed_name,
            const std::vector<const AnimationCurveNode*>& curves,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time)
        {

            NodeMap node_property_map;
            ai_assert(curves.size());

#ifdef ASSIMP_BUILD_DEBUG
            validateAnimCurveNodes(curves, doc.Settings().strictMode);
#endif
            const AnimationCurveNode* curve_node = NULL;
            for (const AnimationCurveNode* node : curves) {
                ai_assert(node);

                if (node->TargetProperty().empty()) {
                    FBXImporter::LogWarn("target property for animation curve not set: " + node->Name());
                    continue;
                }

                curve_node = node;
                if (node->Curves().empty()) {
                    FBXImporter::LogWarn("no animation curves assigned to AnimationCurveNode: " + node->Name());
                    continue;
                }

                node_property_map[node->TargetProperty()].push_back(node);
            }

            ai_assert(curve_node);
            ai_assert(curve_node->TargetAsModel());

            const Model& target = *curve_node->TargetAsModel();

            // check for all possible transformation components
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM];

            bool has_any = false;
            bool has_complex = false;

            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                // inverse pivots don't exist in the input, we just generate them
                if (comp == TransformationComp_RotationPivotInverse || comp == TransformationComp_ScalingPivotInverse) {
                    chain[i] = node_property_map.end();
                    continue;
                }

                chain[i] = node_property_map.find(NameTransformationCompProperty(comp));
                if (chain[i] != node_property_map.end()) {

                    // check if this curves contains redundant information by looking
                    // up the corresponding node's transformation chain.
                    if (doc.Settings().optimizeEmptyAnimationCurves &&
                        IsRedundantAnimationData(target, comp, (*chain[i]).second)) {

                        FBXImporter::LogDebug("dropping redundant animation channel for node " + target.Name());
                        continue;
                    }

                    has_any = true;

                    if (comp != TransformationComp_Rotation && comp != TransformationComp_Scaling && comp != TransformationComp_Translation)
                    {
                        has_complex = true;
                    }
                }
            }

            if (!has_any) {
                FBXImporter::LogWarn("ignoring node animation, did not find any transformation key frames");
                return;
            }

            // this needs to play nicely with GenerateTransformationNodeChain() which will
            // be invoked _later_ (animations come first). If this node has only rotation,
            // scaling and translation _and_ there are no animated other components either,
            // we can use a single node and also a single node animation channel.
            if (!has_complex && !NeedsComplexTransformationChain(target)) {

                aiNodeAnim* const nd = GenerateSimpleNodeAnim(fixed_name, target, chain,
                    node_property_map.end(),
                    layer_map,
                    start, stop,
                    max_time,
                    min_time,
                    true // input is TRS order, assimp is SRT
                );

                ai_assert(nd);
                if (nd->mNumPositionKeys == 0 && nd->mNumRotationKeys == 0 && nd->mNumScalingKeys == 0) {
                    delete nd;
                }
                else {
                    node_anims.push_back(nd);
                }
                return;
            }

            // otherwise, things get gruesome and we need separate animation channels
            // for each part of the transformation chain. Remember which channels
            // we generated and pass this information to the node conversion
            // code to avoid nodes that have identity transform, but non-identity
            // animations, being dropped.
            unsigned int flags = 0, bit = 0x1;
            for (size_t i = 0; i < TransformationComp_MAXIMUM; ++i, bit <<= 1) {
                const TransformationComp comp = static_cast<TransformationComp>(i);

                if (chain[i] != node_property_map.end()) {
                    flags |= bit;

                    ai_assert(comp != TransformationComp_RotationPivotInverse);
                    ai_assert(comp != TransformationComp_ScalingPivotInverse);

                    const std::string& chain_name = NameTransformationChainNode(fixed_name, comp);

                    aiNodeAnim* na = nullptr;
                    switch (comp)
                    {
                    case TransformationComp_Rotation:
                    case TransformationComp_PreRotation:
                    case TransformationComp_PostRotation:
                    case TransformationComp_GeometricRotation:
                        na = GenerateRotationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    case TransformationComp_RotationOffset:
                    case TransformationComp_RotationPivot:
                    case TransformationComp_ScalingOffset:
                    case TransformationComp_ScalingPivot:
                    case TransformationComp_Translation:
                    case TransformationComp_GeometricTranslation:
                        na = GenerateTranslationNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        // pivoting requires us to generate an implicit inverse channel to undo the pivot translation
                        if (comp == TransformationComp_RotationPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_RotationPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }
                        else if (comp == TransformationComp_ScalingPivot) {
                            const std::string& invName = NameTransformationChainNode(fixed_name,
                                TransformationComp_ScalingPivotInverse);

                            aiNodeAnim* const inv = GenerateTranslationNodeAnim(invName,
                                target,
                                (*chain[i]).second,
                                layer_map,
                                start, stop,
                                max_time,
                                min_time,
                                true);

                            ai_assert(inv);
                            if (inv->mNumPositionKeys == 0 && inv->mNumRotationKeys == 0 && inv->mNumScalingKeys == 0) {
                                delete inv;
                            }
                            else {
                                node_anims.push_back(inv);
                            }

                            ai_assert(TransformationComp_RotationPivotInverse > i);
                            flags |= bit << (TransformationComp_RotationPivotInverse - i);
                        }

                        break;

                    case TransformationComp_Scaling:
                    case TransformationComp_GeometricScaling:
                        na = GenerateScalingNodeAnim(chain_name,
                            target,
                            (*chain[i]).second,
                            layer_map,
                            start, stop,
                            max_time,
                            min_time);

                        break;

                    default:
                        ai_assert(false);
                    }

                    ai_assert(na);
                    if (na->mNumPositionKeys == 0 && na->mNumRotationKeys == 0 && na->mNumScalingKeys == 0) {
                        delete na;
                    }
                    else {
                        node_anims.push_back(na);
                    }
                    continue;
                }
            }

            node_anim_chain_bits[fixed_name] = flags;
        }